

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AttitudeQuaternionEKF.cpp
# Opt level: O3

bool __thiscall
iDynTree::AttitudeQuaternionEKF::setInternalStateInitialOrientation
          (AttitudeQuaternionEKF *this,Span<double,__1L> *orientationBuffer)

{
  bool bVar1;
  pointer peVar2;
  long lVar3;
  AttitudeEstimatorState *pAVar4;
  AttitudeEstimatorState *pAVar5;
  Span<double,__1L> x0_span;
  Span<double,__1L> local_28;
  
  if ((orientationBuffer->storage_).super_extent_type<_1L>.size_ == 4) {
    peVar2 = (orientationBuffer->storage_).data_;
    (this->m_state_qekf).m_orientation.m_data[0] = *peVar2;
    (this->m_state_qekf).m_orientation.m_data[1] = peVar2[1];
    (this->m_state_qekf).m_orientation.m_data[2] = peVar2[2];
    (this->m_state_qekf).m_orientation.m_data[3] = peVar2[3];
    pAVar4 = &this->m_state_qekf;
    pAVar5 = &this->m_initial_state_qekf;
    for (lVar3 = 10; lVar3 != 0; lVar3 = lVar3 + -1) {
      (pAVar5->m_orientation).m_data[0] = (pAVar4->m_orientation).m_data[0];
      pAVar4 = (AttitudeEstimatorState *)((pAVar4->m_orientation).m_data + 1);
      pAVar5 = (AttitudeEstimatorState *)((pAVar5->m_orientation).m_data + 1);
    }
    serializeStateVector(this);
    peVar2 = (pointer)iDynTree::VectorDynSize::data();
    local_28.storage_.super_extent_type<_1L>.size_ = iDynTree::VectorDynSize::size();
    local_28.storage_.data_ = peVar2;
    bVar1 = DiscreteExtendedKalmanFilterHelper::ekfSetInitialState
                      (&this->super_DiscreteExtendedKalmanFilterHelper,&local_28);
  }
  else {
    iDynTree::reportError
              ("AttitudeQuaternionEKF","setInternalStateInitialOrientation",
               "orientation size mismatch, using default state");
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool iDynTree::AttitudeQuaternionEKF::setInternalStateInitialOrientation(const iDynTree::Span< double >& orientationBuffer)
{
    if ((size_t)orientationBuffer.size() != m_state_qekf.m_orientation.size())
    {
        iDynTree::reportError("AttitudeQuaternionEKF", "setInternalStateInitialOrientation", "orientation size mismatch, using default state");
        return false;
    }

    m_state_qekf.m_orientation(0) = orientationBuffer(0);
    m_state_qekf.m_orientation(1) = orientationBuffer(1);
    m_state_qekf.m_orientation(2) = orientationBuffer(2);
    m_state_qekf.m_orientation(3) = orientationBuffer(3);

    m_initial_state_qekf = m_state_qekf;
    serializeStateVector();
    iDynTree::Span<double> x0_span(m_x.data(), m_x.size());
    bool ok = ekfSetInitialState(x0_span);

    return ok;
}